

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_mt_test.cpp
# Opt level: O0

MPP_RET mt_test_ctx_init(MpiEncMtCtxInfo *info)

{
  MpiEncTestArgs *pMVar1;
  int iVar2;
  MppFrameFormat MVar3;
  CamSource *pCVar4;
  FILE *pFVar5;
  uint local_2c;
  uint local_28;
  MPP_RET local_24;
  MPP_RET ret;
  MpiEncMtTestData *p;
  MpiEncTestArgs *cmd;
  MpiEncMtCtxInfo *info_local;
  
  pMVar1 = info->cmd;
  local_24 = MPP_OK;
  (info->ctx).width = pMVar1->width;
  (info->ctx).height = pMVar1->height;
  if (pMVar1->hor_stride == 0) {
    local_28 = pMVar1->width + 0xfU & 0xfffffff0;
  }
  else {
    local_28 = pMVar1->hor_stride;
  }
  (info->ctx).hor_stride = local_28;
  if (pMVar1->ver_stride == 0) {
    local_2c = pMVar1->height + 0xfU & 0xfffffff0;
  }
  else {
    local_2c = pMVar1->ver_stride;
  }
  (info->ctx).ver_stride = local_2c;
  (info->ctx).fmt = pMVar1->format;
  (info->ctx).type = pMVar1->type;
  (info->ctx).bps = pMVar1->bps_target;
  (info->ctx).bps_min = pMVar1->bps_min;
  (info->ctx).bps_max = pMVar1->bps_max;
  (info->ctx).rc_mode = pMVar1->rc_mode;
  (info->ctx).frame_num = pMVar1->frame_num;
  if ((pMVar1->type == MPP_VIDEO_CodingMJPEG) && ((info->ctx).frame_num == 0)) {
    _mpp_log_l(4,"mpi_enc_mt_test","jpege default encode only one frame. Use -n [num] for rc case\n"
               ,0);
    (info->ctx).frame_num = 1;
  }
  (info->ctx).gop_mode = pMVar1->gop_mode;
  (info->ctx).gop_len = pMVar1->gop_len;
  (info->ctx).vi_len = pMVar1->vi_len;
  (info->ctx).fps_in_flex = pMVar1->fps_in_flex;
  (info->ctx).fps_in_den = pMVar1->fps_in_den;
  (info->ctx).fps_in_num = pMVar1->fps_in_num;
  (info->ctx).fps_out_flex = pMVar1->fps_out_flex;
  (info->ctx).fps_out_den = pMVar1->fps_out_den;
  (info->ctx).fps_out_num = pMVar1->fps_out_num;
  if (pMVar1->file_input != (char *)0x0) {
    iVar2 = strncmp(pMVar1->file_input,"/dev/video",10);
    if (iVar2 == 0) {
      _mpp_log_l(4,"mpi_enc_mt_test","open camera device",0);
      pCVar4 = camera_source_init(pMVar1->file_input,4,(info->ctx).width,(info->ctx).height,
                                  (info->ctx).fmt);
      (info->ctx).cam_ctx = pCVar4;
      _mpp_log_l(4,"mpi_enc_mt_test","new framecap ok",0);
      if ((info->ctx).cam_ctx == (CamSource *)0x0) {
        _mpp_log_l(2,"mpi_enc_mt_test","open %s fail",0,pMVar1->file_input);
      }
    }
    else {
      pFVar5 = fopen(pMVar1->file_input,"rb");
      (info->ctx).fp_input = (FILE *)pFVar5;
      if ((info->ctx).fp_input == (FILE *)0x0) {
        _mpp_log_l(2,"mpi_enc_mt_test","failed to open input file %s\n",0,pMVar1->file_input);
        _mpp_log_l(2,"mpi_enc_mt_test","create default yuv image for test\n",0);
      }
    }
  }
  if (pMVar1->file_output != (char *)0x0) {
    pFVar5 = fopen(pMVar1->file_output,"w+b");
    (info->ctx).fp_output = (FILE *)pFVar5;
    if ((info->ctx).fp_output == (FILE *)0x0) {
      _mpp_log_l(2,"mpi_enc_mt_test","failed to open output file %s\n",0,pMVar1->file_output);
      local_24 = MPP_ERR_OPEN_FILE;
    }
  }
  if (pMVar1->file_slt != (char *)0x0) {
    pFVar5 = fopen(pMVar1->file_slt,"wt");
    (info->ctx).fp_verify = (FILE *)pFVar5;
    if ((info->ctx).fp_verify == (FILE *)0x0) {
      _mpp_log_l(2,"mpi_enc_mt_test","failed to open verify file %s\n",0,pMVar1->file_slt);
    }
  }
  MVar3 = (info->ctx).fmt & 0xfffff;
  if (MVar3 == MPP_FMT_YUV420SP) {
LAB_00106e0e:
    (info->ctx).frame_size =
         (ulong)(((info->ctx).hor_stride + 0x3f & 0xffffffc0) *
                 ((info->ctx).ver_stride + 0x3f & 0xffffffc0) * 3 >> 1);
  }
  else {
    if (MVar3 != MPP_FMT_YUV422SP) {
      if (MVar3 == MPP_FMT_YUV420P) goto LAB_00106e0e;
      if ((MVar3 != MPP_FMT_YUV422P) && (3 < MVar3 - MPP_FMT_YUV422_YUYV)) {
        if ((MVar3 == MPP_FMT_YUV400) || (MVar3 - MPP_FMT_RGB565 < 0xe)) {
          (info->ctx).frame_size =
               (ulong)(((info->ctx).hor_stride + 0x3f & 0xffffffc0) *
                      ((info->ctx).ver_stride + 0x3f & 0xffffffc0));
        }
        else {
          (info->ctx).frame_size =
               (ulong)(((info->ctx).hor_stride + 0x3f & 0xffffffc0) *
                       ((info->ctx).ver_stride + 0x3f & 0xffffffc0) * 4);
        }
        goto LAB_00106f01;
      }
    }
    (info->ctx).frame_size =
         (ulong)(((info->ctx).hor_stride + 0x3f & 0xffffffc0) *
                 ((info->ctx).ver_stride + 0x3f & 0xffffffc0) * 2);
  }
LAB_00106f01:
  if (((info->ctx).fmt & 0xf00000) == MPP_FMT_YUV420SP) {
    (info->ctx).header_size = 0;
  }
  else {
    (info->ctx).header_size =
         (ulong)((((info->ctx).width + 0xf & 0xfffffff0) * ((info->ctx).height + 0xf & 0xfffffff0)
                 >> 4) + 0xfff & 0xfffff000);
  }
  return local_24;
}

Assistant:

MPP_RET mt_test_ctx_init(MpiEncMtCtxInfo *info)
{
    MpiEncTestArgs *cmd = info->cmd;
    MpiEncMtTestData *p = &info->ctx;
    MPP_RET ret = MPP_OK;

    // get paramter from cmd
    p->width        = cmd->width;
    p->height       = cmd->height;
    p->hor_stride   = (cmd->hor_stride) ? (cmd->hor_stride) :
                      (MPP_ALIGN(cmd->width, 16));
    p->ver_stride   = (cmd->ver_stride) ? (cmd->ver_stride) :
                      (MPP_ALIGN(cmd->height, 16));
    p->fmt          = cmd->format;
    p->type         = cmd->type;
    p->bps          = cmd->bps_target;
    p->bps_min      = cmd->bps_min;
    p->bps_max      = cmd->bps_max;
    p->rc_mode      = cmd->rc_mode;
    p->frame_num    = cmd->frame_num;
    if (cmd->type == MPP_VIDEO_CodingMJPEG && p->frame_num == 0) {
        mpp_log("jpege default encode only one frame. Use -n [num] for rc case\n");
        p->frame_num = 1;
    }
    p->gop_mode     = cmd->gop_mode;
    p->gop_len      = cmd->gop_len;
    p->vi_len       = cmd->vi_len;

    p->fps_in_flex  = cmd->fps_in_flex;
    p->fps_in_den   = cmd->fps_in_den;
    p->fps_in_num   = cmd->fps_in_num;
    p->fps_out_flex = cmd->fps_out_flex;
    p->fps_out_den  = cmd->fps_out_den;
    p->fps_out_num  = cmd->fps_out_num;

    if (cmd->file_input) {
        if (!strncmp(cmd->file_input, "/dev/video", 10)) {
            mpp_log("open camera device");
            p->cam_ctx = camera_source_init(cmd->file_input, 4, p->width, p->height, p->fmt);
            mpp_log("new framecap ok");
            if (p->cam_ctx == NULL)
                mpp_err("open %s fail", cmd->file_input);
        } else {
            p->fp_input = fopen(cmd->file_input, "rb");
            if (NULL == p->fp_input) {
                mpp_err("failed to open input file %s\n", cmd->file_input);
                mpp_err("create default yuv image for test\n");
            }
        }
    }

    if (cmd->file_output) {
        p->fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == p->fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            ret = MPP_ERR_OPEN_FILE;
        }
    }

    if (cmd->file_slt) {
        p->fp_verify = fopen(cmd->file_slt, "wt");
        if (!p->fp_verify)
            mpp_err("failed to open verify file %s\n", cmd->file_slt);
    }

    // update resource parameter
    switch (p->fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420P: {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 3 / 2;
    } break;

    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_YVYU :
    case MPP_FMT_YUV422_UYVY :
    case MPP_FMT_YUV422_VYUY :
    case MPP_FMT_YUV422P :
    case MPP_FMT_YUV422SP : {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 2;
    } break;
    case MPP_FMT_YUV400 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64);
    } break;

    default: {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 4;
    } break;
    }

    if (MPP_FRAME_FMT_IS_FBC(p->fmt))
        p->header_size = MPP_ALIGN(MPP_ALIGN(p->width, 16) * MPP_ALIGN(p->height, 16) / 16, SZ_4K);
    else
        p->header_size = 0;

    return ret;
}